

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afcjk.c
# Opt level: O3

FT_Error af_cjk_hints_detect_features(AF_GlyphHints hints,AF_Dimension dim)

{
  AF_Segment *ppAVar1;
  AF_Edge *ppAVar2;
  AF_Edge *ppAVar3;
  byte bVar4;
  short sVar5;
  undefined2 uVar6;
  short sVar7;
  AF_Direction AVar8;
  long lVar9;
  AF_Segment pAVar10;
  FT_Memory memory;
  AF_StyleMetrics_conflict pAVar11;
  bool bVar12;
  char cVar13;
  FT_Error FVar14;
  FT_Long FVar15;
  long lVar16;
  AF_Edge_conflict pAVar17;
  AF_Edge_conflict pAVar18;
  AF_Point_conflict pAVar19;
  long lVar20;
  ulong uVar21;
  AF_Edge_conflict pAVar22;
  AF_Segment pAVar23;
  long lVar24;
  AF_Segment pAVar25;
  AF_Segment_conflict seg;
  AF_Segment pAVar26;
  AF_Segment_conflict pAVar27;
  AF_Segment_conflict pAVar28;
  AF_Segment pAVar29;
  ushort uVar30;
  int iVar31;
  int iVar32;
  AF_AxisHints axis_00;
  long lVar33;
  uint uVar34;
  long lVar35;
  ulong uVar36;
  uint uVar37;
  ushort uVar38;
  ulong uVar39;
  int iVar40;
  AF_Segment pAVar41;
  AF_Edge *ppAVar42;
  AF_AxisHints axis;
  AF_Edge_conflict local_60;
  AF_Edge_conflict local_38;
  
  uVar39 = (ulong)dim;
  pAVar27 = hints->axis[uVar39].segments;
  iVar31 = hints->axis[uVar39].num_segments;
  FVar14 = af_latin_hints_compute_segments(hints,dim);
  if (FVar14 == 0) {
    axis_00 = hints->axis + uVar39;
    if (0 < iVar31) {
      pAVar28 = pAVar27 + iVar31;
      do {
        pAVar19 = pAVar27->first;
        uVar30 = pAVar19->flags;
        bVar4 = pAVar27->flags;
        pAVar27->flags = bVar4 & 0xfe;
        if (pAVar19 != pAVar27->last) {
          uVar30 = uVar30 & 3;
          do {
            pAVar19 = pAVar19->next;
            uVar38 = pAVar19->flags & 3;
            if (uVar30 == 0 && uVar38 == 0) goto LAB_0018106c;
            uVar30 = uVar38;
          } while (pAVar19 != pAVar27->last);
          pAVar27->flags = bVar4 | 1;
        }
LAB_0018106c:
        pAVar27 = pAVar27 + 1;
      } while (pAVar27 < pAVar28);
    }
    pAVar27 = hints->axis[uVar39].segments;
    iVar31 = axis_00->num_segments;
    AVar8 = hints->axis[uVar39].major_dir;
    uVar37 = *(uint *)&hints->metrics[1].style_class;
    uVar21 = (ulong)(dim != AF_DIMENSION_HORZ) * 0x10;
    FVar15 = FT_DivFix(0xc0,*(FT_Long *)((long)hints->axis[0].embedded.segments + (uVar21 - 0x68)));
    if (0 < (long)iVar31) {
      pAVar41 = pAVar27 + iVar31;
      lVar20 = 0;
      pAVar28 = pAVar27;
      do {
        lVar16 = lVar20;
        pAVar29 = pAVar27;
        if (AVar8 == pAVar28->dir) {
          do {
            if (((lVar16 != 0) && (pAVar29->dir + AVar8 == 0)) &&
               (lVar33 = (long)pAVar29->pos - (long)pAVar28->pos, -1 < lVar33)) {
              uVar6 = pAVar28->max_coord;
              sVar5 = pAVar29->min_coord;
              if (pAVar29->min_coord < pAVar28->min_coord) {
                sVar5 = pAVar28->min_coord;
              }
              sVar7 = pAVar29->max_coord;
              if ((short)uVar6 < sVar7) {
                sVar7 = uVar6;
              }
              lVar35 = (long)sVar7 - (long)sVar5;
              if ((long)(ulong)(uVar37 >> 8) <= lVar35) {
                lVar24 = lVar33 * 8;
                lVar9 = pAVar28->score;
                if ((SBORROW8(lVar24,lVar9 * 9) != lVar24 + lVar9 * -9 < 0) &&
                   ((lVar24 < lVar9 * 7 || (pAVar28->len < lVar35)))) {
                  pAVar28->score = lVar33;
                  pAVar28->len = lVar35;
                  pAVar28->link = pAVar29;
                }
                lVar9 = pAVar29->score;
                if ((SBORROW8(lVar24,lVar9 * 9) != lVar24 + lVar9 * -9 < 0) &&
                   ((lVar24 < lVar9 * 7 || (pAVar29->len < lVar35)))) {
                  pAVar29->score = lVar33;
                  pAVar29->len = lVar35;
                  pAVar29->link = pAVar28;
                }
              }
            }
            pAVar29 = pAVar29 + 1;
            lVar16 = lVar16 + -0x50;
          } while (pAVar29 < pAVar41);
        }
        pAVar28 = pAVar28 + 1;
        lVar20 = lVar20 + 0x50;
        pAVar29 = pAVar27;
      } while (pAVar28 < pAVar41);
      do {
        pAVar25 = pAVar29->link;
        if ((pAVar25 != (AF_Segment)0x0) && (pAVar25->link == pAVar29)) {
          sVar5 = pAVar25->pos;
          sVar7 = pAVar29->pos;
          if ((sVar7 < sVar5) && (lVar20 = pAVar29->score, lVar20 < FVar15)) {
            pAVar28 = pAVar27;
            do {
              if (((((pAVar29 != pAVar28 && pAVar28->pos <= sVar7) &&
                    (pAVar10 = pAVar28->link, pAVar10 != (AF_Segment)0x0)) &&
                   (pAVar10->link == pAVar28)) && (sVar5 <= pAVar10->pos)) &&
                 (((sVar7 != pAVar28->pos || (sVar5 != pAVar10->pos)) &&
                  ((lVar16 = pAVar28->score, lVar20 < lVar16 &&
                   (lVar20 * 4 - lVar16 != 0 && lVar16 <= lVar20 * 4)))))) {
                pAVar26 = pAVar27;
                if (SBORROW8(pAVar29->len,pAVar28->len * 3) != pAVar29->len + pAVar28->len * -3 < 0)
                {
                  pAVar25->link = (AF_Segment)0x0;
                  pAVar29->link = (AF_Segment)0x0;
                  break;
                }
                do {
                  pAVar23 = pAVar25;
                  if ((pAVar26->link == pAVar28) || (pAVar23 = pAVar29, pAVar26->link == pAVar10)) {
                    pAVar26->link = (AF_Segment)0x0;
                    pAVar26->serif = pAVar23;
                  }
                  pAVar26 = pAVar26 + 1;
                } while (pAVar26 < pAVar41);
              }
              pAVar28 = pAVar28 + 1;
            } while (pAVar28 < pAVar41);
          }
        }
        pAVar29 = pAVar29 + 1;
      } while (pAVar29 < pAVar41);
      do {
        pAVar29 = pAVar27->link;
        if ((pAVar29 != (AF_Segment)0x0) && (pAVar27 != pAVar29->link)) {
          pAVar27->link = (AF_Segment)0x0;
          if ((pAVar29->score < FVar15) || (pAVar27->score < pAVar29->score * 4)) {
            pAVar27->serif = pAVar29->link;
          }
        }
        pAVar27 = pAVar27 + 1;
      } while (pAVar27 < pAVar41);
    }
    memory = hints->memory;
    pAVar11 = hints->metrics;
    pAVar27 = hints->axis[uVar39].segments;
    iVar31 = axis_00->num_segments;
    hints->axis[uVar39].num_edges = 0;
    FVar15 = *(FT_Long *)((long)hints->axis[0].embedded.segments + ((uVar21 | 8) - 0x70));
    lVar20 = *(long *)((long)pAVar11 + uVar39 * 0x3838 + 0x1e8);
    lVar33 = (long)(int)FVar15;
    lVar16 = (int)lVar20 * lVar33;
    if (0x10 < (int)((ulong)(lVar16 + (lVar16 >> 0x3f) + 0x8000) >> 0x10)) {
      lVar20 = FT_DivFix(0x10,FVar15);
    }
    if (0 < iVar31) {
      pAVar28 = pAVar27 + iVar31;
      do {
        lVar16 = (long)hints->axis[uVar39].num_edges;
        if (lVar16 < 1) {
          cVar13 = pAVar27->dir;
LAB_00181481:
          FVar14 = af_axis_hints_new_edge
                             (axis_00,(int)pAVar27->pos,(int)cVar13,'\0',memory,&local_38);
          if (FVar14 != 0) {
            return FVar14;
          }
          local_38->link = (AF_Edge)0x0;
          local_38->serif = (AF_Edge)0x0;
          local_38->scale = 0;
          local_38->blue_edge = (AF_Width)0x0;
          local_38->pos = 0;
          local_38->flags = '\0';
          local_38->dir = '\0';
          *(undefined6 *)&local_38->field_0x1a = 0;
          *(undefined8 *)local_38 = 0;
          local_38->opos = 0;
          *(undefined8 *)&local_38->score = 0;
          local_38->first = pAVar27;
          local_38->last = pAVar27;
          local_38->dir = pAVar27->dir;
          sVar5 = pAVar27->pos;
          local_38->fpos = sVar5;
          lVar16 = sVar5 * lVar33;
          lVar16 = lVar16 + (lVar16 >> 0x3f) + 0x8000 >> 0x10;
          local_38->opos = lVar16;
          local_38->pos = lVar16;
          pAVar27->edge_next = pAVar27;
        }
        else {
          pAVar17 = hints->axis[uVar39].edges;
          cVar13 = pAVar27->dir;
          uVar21 = 0xffff;
          lVar35 = 0;
          local_60 = (AF_Edge_conflict)0x0;
          do {
            if (pAVar17[lVar35].dir == cVar13) {
              pAVar22 = pAVar17 + lVar35;
              uVar34 = (int)pAVar27->pos - (int)pAVar22->fpos;
              uVar37 = -uVar34;
              if (0 < (int)uVar34) {
                uVar37 = uVar34;
              }
              uVar36 = (ulong)uVar37 & 0xffff;
              if (uVar36 < uVar21 && (long)uVar36 < lVar20) {
                if (pAVar27->link != (AF_Segment)0x0) {
                  lVar24 = 0;
                  pAVar41 = pAVar22->first;
                  do {
                    if (pAVar41->link != (AF_Segment)0x0) {
                      sVar5 = pAVar27->link->pos;
                      sVar7 = pAVar41->link->pos;
                      iVar31 = (int)sVar7 - (int)sVar5;
                      if (sVar7 < sVar5) {
                        iVar31 = (int)sVar5 - (int)sVar7;
                      }
                      lVar24 = (long)iVar31;
                      if (lVar20 <= lVar24) break;
                    }
                    pAVar41 = pAVar41->edge_next;
                  } while (pAVar41 != pAVar22->first);
                  if (lVar20 <= lVar24) goto LAB_0018144a;
                }
                uVar21 = uVar36;
                local_60 = pAVar22;
              }
            }
LAB_0018144a:
            lVar35 = lVar35 + 1;
          } while (lVar35 != lVar16);
          if (local_60 == (AF_Edge_conflict)0x0) goto LAB_00181481;
          pAVar27->edge_next = local_60->first;
          local_60->last->edge_next = pAVar27;
          local_60->last = pAVar27;
        }
        pAVar27 = pAVar27 + 1;
      } while (pAVar27 < pAVar28);
    }
    lVar20 = (long)hints->axis[uVar39].num_edges;
    if (0 < lVar20) {
      pAVar17 = hints->axis[uVar39].edges;
      pAVar18 = pAVar17 + lVar20;
      pAVar22 = pAVar17;
      do {
        pAVar41 = pAVar22->first;
        pAVar29 = pAVar41;
        if (pAVar41 != (AF_Segment)0x0) {
          do {
            pAVar29->edge = pAVar22;
            ppAVar1 = &pAVar29->edge_next;
            pAVar29 = *ppAVar1;
          } while (*ppAVar1 != pAVar41);
        }
        pAVar22 = pAVar22 + 1;
      } while (pAVar22 < pAVar18);
      do {
        pAVar41 = pAVar17->first;
        ppAVar2 = &pAVar17->link;
        ppAVar3 = &pAVar17->serif;
        iVar31 = 0;
        iVar32 = 0;
        pAVar29 = pAVar41;
        do {
          bVar4 = pAVar29->flags;
          pAVar25 = pAVar29->serif;
          if (pAVar25 == (AF_Segment)0x0) {
            pAVar10 = pAVar29->link;
            if (pAVar29->link != (AF_Segment)0x0) {
LAB_001815a4:
              pAVar25 = pAVar10;
              bVar12 = false;
              ppAVar42 = ppAVar2;
              goto LAB_001815a9;
            }
          }
          else if ((pAVar29->link != (AF_Segment)0x0) || (pAVar25->edge != pAVar17)) {
            pAVar10 = pAVar29->link;
            if (pAVar25->edge == pAVar17) goto LAB_001815a4;
            bVar12 = true;
            ppAVar42 = ppAVar3;
LAB_001815a9:
            pAVar22 = *ppAVar42;
            if (pAVar22 == (AF_Edge_conflict)0x0) {
LAB_001815ee:
              pAVar22 = pAVar25->edge;
            }
            else {
              iVar40 = (int)pAVar17->fpos - (int)pAVar22->fpos;
              uVar30 = (ushort)iVar40;
              uVar38 = -uVar30;
              if (0 < iVar40) {
                uVar38 = uVar30;
              }
              sVar5 = pAVar29->pos;
              sVar7 = pAVar25->pos;
              iVar40 = (int)sVar7 - (int)sVar5;
              if (sVar7 < sVar5) {
                iVar40 = (int)sVar5 - (int)sVar7;
              }
              if (iVar40 < (int)(uint)uVar38) goto LAB_001815ee;
            }
            if (bVar12) {
              *ppAVar3 = pAVar22;
              pAVar22->flags = pAVar22->flags | 2;
            }
            else {
              *ppAVar2 = pAVar22;
            }
          }
          uVar37 = bVar4 & 1;
          iVar31 = iVar31 + uVar37;
          iVar32 = iVar32 + (uint)(byte)((byte)uVar37 ^ 1);
          pAVar29 = pAVar29->edge_next;
        } while (pAVar29 != pAVar41);
        pAVar17->flags = iVar32 <= iVar31 && 0 < iVar31;
        if ((pAVar17->serif != (AF_Edge)0x0) && (*ppAVar2 != (AF_Edge)0x0)) {
          *ppAVar3 = (AF_Edge)0x0;
        }
        pAVar17 = pAVar17 + 1;
      } while (pAVar17 < pAVar18);
    }
    FVar14 = 0;
  }
  return FVar14;
}

Assistant:

static FT_Error
  af_cjk_hints_detect_features( AF_GlyphHints  hints,
                                AF_Dimension   dim )
  {
    FT_Error  error;


    error = af_cjk_hints_compute_segments( hints, dim );
    if ( !error )
    {
      af_cjk_hints_link_segments( hints, dim );

      error = af_cjk_hints_compute_edges( hints, dim );
    }
    return error;
  }